

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O0

FT_Error afm_parse_track_kern(AFM_Parser parser)

{
  FT_Error FVar1;
  AFM_Token AVar2;
  FT_Int FVar3;
  FT_Pointer pvVar4;
  undefined1 local_a8 [8];
  AFM_ValueRec shared_vals [5];
  int local_4c;
  FT_Memory pFStack_48;
  FT_Error error;
  FT_Memory memory;
  FT_Int tmp;
  int n;
  FT_Offset len;
  char *key;
  AFM_TrackKern tk;
  AFM_FontInfo fi;
  AFM_Parser parser_local;
  
  tk = (AFM_TrackKern)parser->FontInfo;
  memory._4_4_ = -1;
  fi = (AFM_FontInfo)parser;
  FVar1 = afm_parser_read_int(parser,(FT_Int *)&memory);
  if ((FVar1 == 0) && (-1 < (int)memory)) {
    *(int *)&tk[1].max_ptsize = (int)memory;
    if ((int)tk[1].max_ptsize != 0) {
      pFStack_48 = *(FT_Memory *)fi;
      pvVar4 = ft_mem_realloc(pFStack_48,0x28,0,(ulong)(uint)tk[1].max_ptsize,(void *)0x0,&local_4c)
      ;
      tk[1].min_kern = (FT_Fixed)pvVar4;
      if (local_4c != 0) {
        return local_4c;
      }
    }
    do {
      while( true ) {
        len = (FT_Offset)afm_parser_next_key((AFM_Parser)fi,'\x01',(FT_Offset *)&tmp);
        if ((char *)len == (char *)0x0) {
          return 0xa0;
        }
        AVar2 = afm_tokenize((char *)len,_tmp);
        if ((AVar2 - AFM_TOKEN_ENDFONTMETRICS < 2) || (AVar2 == AFM_TOKEN_ENDTRACKKERN)) {
          *(int *)&tk[1].max_ptsize = memory._4_4_ + 1;
          return 0;
        }
        if (AVar2 != AFM_TOKEN_TRACKKERN) break;
        memory._4_4_ = memory._4_4_ + 1;
        if ((int)tk[1].max_ptsize <= memory._4_4_) {
          return 0xa0;
        }
        key = (char *)(tk[1].min_kern + (long)memory._4_4_ * 0x28);
        local_a8._0_4_ = AFM_VALUE_TYPE_INTEGER;
        shared_vals[0].u.i = 2;
        shared_vals[1].u.i = 2;
        shared_vals[2].u.i = 2;
        shared_vals[3].u.i = 2;
        FVar3 = afm_parser_read_vals((AFM_Parser)fi,(AFM_Value)local_a8,5);
        if (FVar3 != 5) {
          return 0xa0;
        }
        *(AFM_ValueType_ *)key = shared_vals[0].type;
        *(undefined8 *)(key + 8) = shared_vals[1]._0_8_;
        *(undefined8 *)(key + 0x10) = shared_vals[2]._0_8_;
        *(undefined8 *)(key + 0x18) = shared_vals[3]._0_8_;
        *(undefined8 *)(key + 0x20) = shared_vals[4]._0_8_;
      }
    } while (AVar2 == AFM_TOKEN_UNKNOWN);
  }
  return 0xa0;
}

Assistant:

static FT_Error
  afm_parse_track_kern( AFM_Parser  parser )
  {
    AFM_FontInfo   fi = parser->FontInfo;
    AFM_TrackKern  tk;
    char*          key;
    FT_Offset      len;
    int            n = -1;
    FT_Int         tmp;


    if ( afm_parser_read_int( parser, &tmp ) )
        goto Fail;

    if ( tmp < 0 )
      goto Fail;

    fi->NumTrackKern = (FT_UInt)tmp;

    if ( fi->NumTrackKern )
    {
      FT_Memory  memory = parser->memory;
      FT_Error   error;


      if ( FT_QNEW_ARRAY( fi->TrackKerns, fi->NumTrackKern ) )
        return error;
    }

    while ( ( key = afm_parser_next_key( parser, 1, &len ) ) != 0 )
    {
      AFM_ValueRec  shared_vals[5];


      switch ( afm_tokenize( key, len ) )
      {
      case AFM_TOKEN_TRACKKERN:
        n++;

        if ( n >= (int)fi->NumTrackKern )
          goto Fail;

        tk = fi->TrackKerns + n;

        shared_vals[0].type = AFM_VALUE_TYPE_INTEGER;
        shared_vals[1].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[2].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[3].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[4].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 5 ) != 5 )
          goto Fail;

        tk->degree     = shared_vals[0].u.i;
        tk->min_ptsize = shared_vals[1].u.f;
        tk->min_kern   = shared_vals[2].u.f;
        tk->max_ptsize = shared_vals[3].u.f;
        tk->max_kern   = shared_vals[4].u.f;

        break;

      case AFM_TOKEN_ENDTRACKKERN:
      case AFM_TOKEN_ENDKERNDATA:
      case AFM_TOKEN_ENDFONTMETRICS:
        fi->NumTrackKern = (FT_UInt)( n + 1 );
        return FT_Err_Ok;

      case AFM_TOKEN_UNKNOWN:
        break;

      default:
        goto Fail;
      }
    }

  Fail:
    return FT_THROW( Syntax_Error );
  }